

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::FboTestUtil::GradientShader::GradientShader
          (GradientShader *this,DataType outputType)

{
  ShaderProgramDeclaration *pSVar1;
  char *pcVar2;
  allocator<char> local_35a;
  allocator<char> local_359;
  allocator<char> local_358;
  allocator<char> local_357;
  allocator<char> local_356;
  allocator<char> local_355;
  FragmentOutput local_354;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  FragmentSource local_2b0;
  string local_290 [32];
  VertexSource local_270;
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  VertexToFragmentVarying local_1d0;
  Uniform local_1c8;
  Uniform local_1a0;
  VertexAttribute local_178;
  VertexAttribute local_150;
  ShaderProgramDeclaration local_128;
  
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_128);
  std::__cxx11::string::string<std::allocator<char>>(local_1f0,"a_position",&local_355);
  std::__cxx11::string::string((string *)&local_150,local_1f0);
  local_150.type = GENERICVECTYPE_FLOAT;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_128,&local_150);
  std::__cxx11::string::string<std::allocator<char>>(local_210,"a_coord",&local_356);
  std::__cxx11::string::string((string *)&local_178,local_210);
  local_178.type = GENERICVECTYPE_FLOAT;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_178);
  local_1d0.type = GENERICVECTYPE_FLOAT;
  local_1d0.flatshade = false;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1d0);
  if (outputType == TYPE_FLOAT_VEC4) {
    local_354.type = GENERICVECTYPE_FLOAT;
  }
  else if (outputType == TYPE_UINT_VEC4) {
    local_354.type = GENERICVECTYPE_UINT32;
  }
  else if (outputType == TYPE_INT_VEC4) {
    local_354.type = GENERICVECTYPE_INT32;
  }
  else {
    local_354.type = GENERICVECTYPE_LAST;
  }
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_354);
  std::__cxx11::string::string<std::allocator<char>>(local_230,"u_gradientMin",&local_357);
  std::__cxx11::string::string((string *)&local_1a0,local_230);
  local_1a0.type = TYPE_FLOAT_VEC4;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1a0);
  std::__cxx11::string::string<std::allocator<char>>(local_250,"u_gradientMax",&local_358);
  std::__cxx11::string::string((string *)&local_1c8,local_250);
  local_1c8.type = TYPE_FLOAT_VEC4;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1c8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_290,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec4 a_coord;\nout highp vec4 v_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_coord;\n}\n"
             ,&local_359);
  std::__cxx11::string::string((string *)&local_270,local_290);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_270);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_350,
             "#version 300 es\nin highp vec4 v_coord;\nuniform highp vec4 u_gradientMin;\nuniform highp vec4 u_gradientMax;\nlayout(location = 0) out highp "
             ,&local_35a);
  pcVar2 = glu::getDataTypeName(outputType);
  std::operator+(&local_330,&local_350,pcVar2);
  std::operator+(&local_310,&local_330,
                 " o_color;\nvoid main (void)\n{\n\thighp float x = v_coord.x;\n\thighp float y = v_coord.y;\n\thighp float f0 = (x + y) * 0.5;\n\thighp float f1 = 0.5 + (x - y) * 0.5;\n\thighp vec4 fv = vec4(f0, f1, 1.0f-f0, 1.0f-f1);\n\to_color = "
                );
  pcVar2 = glu::getDataTypeName(outputType);
  std::operator+(&local_2f0,&local_310,pcVar2);
  std::operator+(&local_2d0,&local_2f0,"(u_gradientMin + (u_gradientMax-u_gradientMin)*fv);\n}\n");
  std::__cxx11::string::string((string *)&local_2b0,(string *)&local_2d0);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_2b0);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pSVar1);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string(local_290);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string(local_250);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string(local_230);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string(local_210);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string(local_1f0);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_128);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_01e45008;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_01e45040;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_01e45058;
  *(DataType *)&(this->super_ShaderProgram).field_0x154 = outputType;
  return;
}

Assistant:

GradientShader::GradientShader (glu::DataType outputType)
	: ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
					<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::VertexAttribute("a_coord", rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::VertexToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::FragmentOutput(mapDataTypeToGenericVecType(outputType))
					<< sglr::pdec::Uniform("u_gradientMin", glu::TYPE_FLOAT_VEC4)
					<< sglr::pdec::Uniform("u_gradientMax", glu::TYPE_FLOAT_VEC4)
					<< sglr::pdec::VertexSource(
							"#version 300 es\n"
							"in highp vec4 a_position;\n"
							"in highp vec4 a_coord;\n"
							"out highp vec4 v_coord;\n"
							"void main (void)\n"
							"{\n"
							"	gl_Position = a_position;\n"
							"	v_coord = a_coord;\n"
							"}\n")
					<< sglr::pdec::FragmentSource(
							string(
								"#version 300 es\n"
								"in highp vec4 v_coord;\n"
								"uniform highp vec4 u_gradientMin;\n"
								"uniform highp vec4 u_gradientMax;\n"
								"layout(location = 0) out highp ") + glu::getDataTypeName(outputType) + " o_color;\n"
								"void main (void)\n"
								"{\n"
								"	highp float x = v_coord.x;\n"
								"	highp float y = v_coord.y;\n"
								"	highp float f0 = (x + y) * 0.5;\n"
								"	highp float f1 = 0.5 + (x - y) * 0.5;\n"
								"	highp vec4 fv = vec4(f0, f1, 1.0f-f0, 1.0f-f1);\n"
								"	o_color = " + glu::getDataTypeName(outputType) + "(u_gradientMin + (u_gradientMax-u_gradientMin)*fv);\n"
								"}\n"))
	, m_outputType(outputType)
{
}